

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

int Sim_UtilCountPairsOnePrint(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  long lVar1;
  uint i;
  uint k;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (0 < vSupport->nSize) {
    lVar4 = 1;
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      if (lVar1 < vSupport->nSize) {
        i = vSupport->pArray[lVar3];
        lVar3 = lVar4;
        do {
          k = vSupport->pArray[lVar3];
          iVar2 = Extra_BitMatrixLookup1(pMat,i,k);
          if (iVar2 != 0) {
            printf("(%d,%d) ",(ulong)i,(ulong)k);
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < vSupport->nSize);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar1;
    } while (lVar1 < vSupport->nSize);
  }
  return 0;
}

Assistant:

int Sim_UtilCountPairsOnePrint( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        if ( Extra_BitMatrixLookup1( pMat, i, k ) )
            printf( "(%d,%d) ", i, k );
    return 0;
}